

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O2

void __thiscall psy::C::SemanticModelTester::case0300(SemanticModelTester *this)

{
  bool bVar1;
  SyntaxKind SVar2;
  TagDeclarationSymbol *this_00;
  TagType *pTVar3;
  Lexeme *pLVar4;
  undefined8 uVar5;
  ostream *poVar6;
  int iVar7;
  allocator<char> local_6a;
  allocator<char> local_69;
  SemanticModel *local_68;
  SyntaxNode *local_60;
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"struct x { int _ ; } ;",&local_69);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_6a);
  compile<psy::C::StructOrUnionDeclarationSyntax>
            ((SemanticModelTester *)&local_68,(string *)this,&local_58);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&local_58);
  SVar2 = C::SyntaxNode::kind(local_60);
  if (SVar2 == StructDeclaration) {
    this_00 = (TagDeclarationSymbol *)
              SemanticModel::structFor(local_68,(StructOrUnionDeclarationSyntax *)local_60);
    if (this_00 != (TagDeclarationSymbol *)0x0) {
      pTVar3 = TagDeclarationSymbol::introducedNewType(this_00);
      pLVar4 = &TagType::tag(pTVar3)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_58,pLVar4);
      bVar1 = std::operator==(&local_58,"x");
      std::__cxx11::string::~string((string *)&local_58);
      if (bVar1) {
        return;
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
      pTVar3 = TagDeclarationSymbol::introducedNewType(this_00);
      pLVar4 = &TagType::tag(pTVar3)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_58,pLVar4);
      poVar6 = std::operator<<(poVar6,(string *)&local_58);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
      poVar6 = std::operator<<(poVar6,"x");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"\t\t");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x1ce);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&local_58);
      goto LAB_0038c3ea;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpression is NOT ");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    iVar7 = 0x1cd;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
    SVar2 = C::SyntaxNode::kind(local_60);
    poVar6 = C::operator<<(poVar6,SVar2);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
    poVar6 = C::operator<<(poVar6,StructDeclaration);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    iVar7 = 0x1cb;
  }
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar7);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_0038c3ea:
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0300()
{
    auto [tyDeclNode, semaModel] =
            compile<StructOrUnionDeclarationSyntax>("struct x { int _ ; } ;");

    PSY_EXPECT_EQ_ENU(tyDeclNode->kind(), SyntaxKind::StructDeclaration, SyntaxKind);
    const StructDeclarationSymbol* strukt = semaModel->structFor(tyDeclNode->asStructOrUnionDeclaration());
    PSY_EXPECT_TRUE(strukt);
    PSY_EXPECT_EQ_STR(strukt->introducedNewType()->tag()->valueText(), "x");
}